

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O3

VkShaderModule createShaderModule(Init *init,vector<char,_std::allocator<char>_> *code)

{
  VkResult VVar1;
  VkShaderModule shaderModule;
  VkShaderModule local_30;
  VkShaderModuleCreateInfo local_28;
  
  local_28.pNext = (void *)0x0;
  local_28.flags = 0;
  local_28._20_4_ = 0;
  local_28.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
  local_28._4_4_ = 0;
  local_28.pCode =
       (uint32_t *)
       (code->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  local_28.codeSize =
       (long)(code->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
             ._M_finish - (long)local_28.pCode;
  VVar1 = (*(init->disp).fp_vkCreateShaderModule)
                    ((init->disp).device,&local_28,(VkAllocationCallbacks *)0x0,&local_30);
  if (VVar1 != VK_SUCCESS) {
    local_30 = (VkShaderModule)0x0;
  }
  return local_30;
}

Assistant:

VkShaderModule createShaderModule(Init& init, const std::vector<char>& code) {
    VkShaderModuleCreateInfo create_info = {};
    create_info.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
    create_info.codeSize = code.size();
    create_info.pCode = reinterpret_cast<const uint32_t*>(code.data());

    VkShaderModule shaderModule;
    if (init.disp.createShaderModule(&create_info, nullptr, &shaderModule) != VK_SUCCESS) {
        return VK_NULL_HANDLE; // failed to create shader module
    }

    return shaderModule;
}